

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

void init_attr(int np)

{
  schar sVar1;
  char cVar2;
  bool bVar3;
  int local_18;
  int local_14;
  int tryct;
  int x;
  int i;
  int np_local;
  
  x = np;
  for (tryct = 0; tryct < 6; tryct = tryct + 1) {
    sVar1 = urole.attrbase[tryct];
    u.amax.a[tryct] = sVar1;
    u.acurr.a[tryct] = sVar1;
    u.atime.a[tryct] = '\0';
    u.atemp.a[tryct] = '\0';
    x = x - urole.attrbase[tryct];
  }
  local_18 = 0;
  while (0 < x && local_18 < 100) {
    local_14 = rn2(100);
    tryct = 0;
    while( true ) {
      bVar3 = false;
      if (tryct < 6) {
        local_14 = local_14 - urole.attrdist[tryct];
        bVar3 = 0 < local_14;
      }
      if (!bVar3) break;
      tryct = tryct + 1;
    }
    if (tryct < 6) {
      if (((tryct == 0) && (u.umonnum != u.umonster)) &&
         (((youmonst.data)->mflags2 & 0x4000000) != 0)) {
        cVar2 = 'v';
      }
      else {
        cVar2 = urace.attrmax[tryct];
      }
      if (u.acurr.a[tryct] < cVar2) {
        local_18 = 0;
        u.acurr.a[tryct] = u.acurr.a[tryct] + '\x01';
        u.amax.a[tryct] = u.amax.a[tryct] + '\x01';
        x = x + -1;
      }
      else {
        local_18 = local_18 + 1;
      }
    }
  }
  local_18 = 0;
  while (x < 0 && local_18 < 100) {
    local_14 = rn2(100);
    tryct = 0;
    while( true ) {
      bVar3 = false;
      if (tryct < 6) {
        local_14 = local_14 - urole.attrdist[tryct];
        bVar3 = 0 < local_14;
      }
      if (!bVar3) break;
      tryct = tryct + 1;
    }
    if (tryct < 6) {
      if (urace.attrmin[tryct] < u.acurr.a[tryct]) {
        local_18 = 0;
        u.acurr.a[tryct] = u.acurr.a[tryct] + -1;
        u.amax.a[tryct] = u.amax.a[tryct] + -1;
        x = x + 1;
      }
      else {
        local_18 = local_18 + 1;
      }
    }
  }
  return;
}

Assistant:

void init_attr(int np)
{
	int	i, x, tryct;


	for (i = 0; i < A_MAX; i++) {
	    ABASE(i) = AMAX(i) = urole.attrbase[i];
	    ATEMP(i) = ATIME(i) = 0;
	    np -= urole.attrbase[i];
	}

	tryct = 0;
	while (np > 0 && tryct < 100) {

	    x = rn2(100);
	    for (i = 0; (i < A_MAX) && ((x -= urole.attrdist[i]) > 0); i++) ;
	    if (i >= A_MAX) continue; /* impossible */

	    if (ABASE(i) >= ATTRMAX(i)) {

		tryct++;
		continue;
	    }
	    tryct = 0;
	    ABASE(i)++;
	    AMAX(i)++;
	    np--;
	}

	tryct = 0;
	while (np < 0 && tryct < 100) {		/* for redistribution */

	    x = rn2(100);
	    for (i = 0; (i < A_MAX) && ((x -= urole.attrdist[i]) > 0); i++) ;
	    if (i >= A_MAX) continue; /* impossible */

	    if (ABASE(i) <= ATTRMIN(i)) {

		tryct++;
		continue;
	    }
	    tryct = 0;
	    ABASE(i)--;
	    AMAX(i)--;
	    np++;
	}
}